

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.h
# Opt level: O0

void __thiscall vm_httpreq_cookie::~vm_httpreq_cookie(vm_httpreq_cookie *this)

{
  vm_httpreq_cookie *pvVar1;
  vm_httpreq_cookie *in_RDI;
  
  lib_free_str((char *)0x2591bb);
  lib_free_str((char *)0x2591cb);
  if ((in_RDI->nxt != (vm_httpreq_cookie *)0x0) &&
     (pvVar1 = in_RDI->nxt, pvVar1 != (vm_httpreq_cookie *)0x0)) {
    ~vm_httpreq_cookie(in_RDI);
    operator_delete(pvVar1,0x18);
  }
  return;
}

Assistant:

~vm_httpreq_cookie()
    {
        lib_free_str(name);
        lib_free_str(val);
        if (nxt != 0)
            delete nxt;
    }